

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  int iVar1;
  size_t sVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  U32 nbSymbols;
  U32 tableLog;
  
  tableLog = 0;
  nbSymbols = 0;
  sVar10 = 0xffffffffffffffd4;
  if ((0x13f < wkspSize) &&
     (sVar2 = HUF_readStats((BYTE *)((long)workSpace + 0x40),0x100,(U32 *)workSpace,&nbSymbols,
                            &tableLog,src,srcSize), sVar10 = sVar2, sVar2 < 0xffffffffffffff89)) {
    uVar8 = *DTable;
    sVar10 = 0xffffffffffffffd4;
    if (tableLog <= (uVar8 & 0xff) + 1) {
      *(char *)DTable = (char)uVar8;
      *(undefined1 *)((long)DTable + 1) = 0;
      *(char *)((long)DTable + 2) = (char)tableLog;
      *(char *)((long)DTable + 3) = (char)(uVar8 >> 0x18);
      iVar6 = 0;
      for (uVar4 = 0; tableLog != uVar4; uVar4 = uVar4 + 1) {
        iVar1 = *(int *)((long)workSpace + uVar4 * 4 + 4);
        bVar3 = (byte)uVar4;
        *(int *)((long)workSpace + uVar4 * 4 + 4) = iVar6;
        iVar6 = (iVar1 << (bVar3 & 0x1f)) + iVar6;
      }
      for (uVar4 = 0; sVar10 = sVar2, uVar4 != nbSymbols; uVar4 = uVar4 + 1) {
        bVar3 = *(byte *)((long)workSpace + uVar4 + 0x40);
        uVar5 = (ulong)bVar3;
        uVar7 = (ulong)*(uint *)((long)workSpace + uVar5 * 4);
        uVar9 = uVar7;
        for (; uVar8 = (int)uVar9 + ((1 << (bVar3 & 0x1f)) >> 1), uVar7 < uVar8; uVar7 = uVar7 + 1)
        {
          *(char *)((long)DTable + uVar7 * 2 + 4) = (char)uVar4;
          *(byte *)((long)DTable + uVar7 * 2 + 5) = ((char)tableLog + '\x01') - bVar3;
          uVar9 = (ulong)*(uint *)((long)workSpace + uVar5 * 4);
        }
        *(uint *)((long)workSpace + uVar5 * 4) = uVar8;
      }
    }
  }
  return sVar10;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;

    U32* rankVal;
    BYTE* huffWeight;
    size_t spaceUsed32 = 0;

    rankVal = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_ABSOLUTEMAX + 1;
    huffWeight = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    HUF_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX + 1, rankVal, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Calculate starting value for each rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<tableLog+1; n++) {
            U32 const current = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = current;
    }   }

    /* fill DTable */
    {   U32 n;
        for (n=0; n<nbSymbols; n++) {
            U32 const w = huffWeight[n];
            U32 const length = (1 << w) >> 1;
            U32 u;
            HUF_DEltX2 D;
            D.byte = (BYTE)n; D.nbBits = (BYTE)(tableLog + 1 - w);
            for (u = rankVal[w]; u < rankVal[w] + length; u++)
                dt[u] = D;
            rankVal[w] += length;
    }   }

    return iSize;
}